

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::NamespaceOpener::ChangeTo
          (NamespaceOpener *this,lts_20250127 *param_2,undefined8 param_3)

{
  Printer *pPVar1;
  NamespaceOpener *pNVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pbVar6;
  long lVar7;
  allocator<char> local_151;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_150;
  NamespaceOpener *local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_stack;
  string local_128;
  string local_108;
  undefined1 local_e8 [184];
  
  absl::lts_20250127::StrSplit<char_const*,absl::lts_20250127::SkipEmpty>
            ((Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)local_e8,param_2,param_3,"::");
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
            (&new_stack,
             (Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)local_e8);
  std::__cxx11::string::~string((string *)(local_e8 + 0x10));
  local_150 = &this->name_stack_;
  pbVar6 = (this->name_stack_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->name_stack_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5;
  uVar5 = (long)new_stack.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)new_stack.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar4 <= uVar5) {
    uVar5 = uVar4;
  }
  lVar7 = 0;
  uVar4 = 0;
  local_148 = this;
  do {
    if (uVar5 == uVar4) {
LAB_0015d48f:
      lVar7 = (long)(local_148->name_stack_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6;
      uVar4 = lVar7 >> 5;
      for (; pNVar2 = local_148, uVar5 < uVar4; uVar4 = uVar4 - 1) {
        pPVar1 = local_148->p_;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"ns",&local_151);
        io::Printer::Sub::Sub<std::__cxx11::string&>
                  ((Sub *)local_e8,&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(local_150->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus._M_p + lVar7))
        ;
        io::Printer::Emit(pPVar1,(Sub *)local_e8,1,0x20,"\n      }  // namespace $ns$\n    ");
        io::Printer::Sub::~Sub((Sub *)local_e8);
        std::__cxx11::string::~string((string *)&local_108);
        lVar7 = lVar7 + -0x20;
      }
      lVar7 = uVar5 << 5;
      for (; uVar5 < (ulong)((long)new_stack.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)new_stack.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar5 = uVar5 + 1) {
        pPVar1 = pNVar2->p_;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"ns",&local_151);
        io::Printer::Sub::Sub<std::__cxx11::string&>
                  ((Sub *)local_e8,&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&((new_stack.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7))
        ;
        io::Printer::Emit(pPVar1,(Sub *)local_e8,1,0x1c,"\n      namespace $ns$ {\n    ");
        io::Printer::Sub::~Sub((Sub *)local_e8);
        std::__cxx11::string::~string((string *)&local_128);
        lVar7 = lVar7 + 0x20;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(local_150,&new_stack);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&new_stack);
      return;
    }
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar6->_M_dataplus)._M_p + lVar7),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&((new_stack.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar7));
    if (bVar3) {
      pbVar6 = (local_150->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar5 = uVar4;
      goto LAB_0015d48f;
    }
    uVar4 = uVar4 + 1;
    pbVar6 = (local_150->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar7 = lVar7 + 0x20;
  } while( true );
}

Assistant:

void NamespaceOpener::ChangeTo(absl::string_view name,
                               io::Printer::SourceLocation loc) {
  std::vector<std::string> new_stack =
      absl::StrSplit(name, "::", absl::SkipEmpty());
  size_t len = std::min(name_stack_.size(), new_stack.size());
  size_t common_idx = 0;
  while (common_idx < len) {
    if (name_stack_[common_idx] != new_stack[common_idx]) {
      break;
    }
    ++common_idx;
  }

  for (size_t i = name_stack_.size(); i > common_idx; i--) {
    p_->Emit({{"ns", name_stack_[i - 1]}}, R"(
      }  // namespace $ns$
    )",
             loc);
  }
  for (size_t i = common_idx; i < new_stack.size(); ++i) {
    p_->Emit({{"ns", new_stack[i]}}, R"(
      namespace $ns$ {
    )",
             loc);
  }

  name_stack_ = std::move(new_stack);
}